

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<char_const(&)[24],char_const(&)[7],kj::String,char_const(&)[3],char_const(&)[3]>
          (String *__return_storage_ptr__,kj *this,char (*params) [24],char (*params_1) [7],
          String *params_2,char (*params_3) [3],char (*params_4) [3])

{
  char *pcVar1;
  ArrayPtr<const_char> AVar2;
  ArrayPtr<const_char> *params_4_00;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  ArrayPtr<const_char> local_38;
  
  local_68 = toCharSequence<char_const(&)[24]>((char (*) [24])this);
  AVar2 = toCharSequence<char_const(&)[7]>((char (*) [7])params);
  params_4_00 = (ArrayPtr<const_char> *)AVar2.ptr;
  pcVar1 = *(char **)(params_1[1] + 1);
  local_38.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_38.ptr = *(char **)params_1;
  }
  local_38.size_ = (size_t)(char *)0x0;
  if (pcVar1 != (char *)0x0) {
    local_38.size_ = (size_t)(pcVar1 + -1);
  }
  local_48 = toCharSequence<char_const(&)[3]>((char (*) [3])params_2);
  local_58 = toCharSequence<char_const(&)[3]>(params_3);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_68,(ArrayPtr<const_char> *)&stack0xffffffffffffff88,
             &local_38,&local_48,&local_58,params_4_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}